

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONAcroform(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pQVar2;
  bool bVar3;
  int json_version;
  pointer pQVar4;
  pointer this_00;
  element_type *peVar5;
  allocator<char> local_371;
  JSON j_choices;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_360 [2];
  JSON j_field;
  string local_330;
  JSON j_annot;
  allocator<char> local_2f9 [9];
  QPDFFormFieldObjectHelper ffh;
  undefined1 local_2b0 [16];
  JSON j_acroform;
  JSON j_fields;
  QPDFAcroFormDocumentHelper afdh;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_230;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_218;
  JSON local_200;
  JSON local_1f0;
  JSON local_1e0;
  JSON local_1d0;
  JSON local_1c0;
  JSON local_1b0;
  JSON local_1a0;
  JSON local_190;
  JSON local_180;
  JSON local_170;
  JSON local_160;
  JSON local_150;
  JSON local_140;
  JSON local_130;
  JSON local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  QPDFPageObjectHelper local_a0;
  QPDFAnnotationObjectHelper local_68;
  
  local_2f9._1_8_ = this;
  JSON::makeDictionary();
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&afdh,pdf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ffh,"hasacroform",(allocator<char> *)&local_330);
  QPDFAcroFormDocumentHelper::hasAcroForm(&afdh);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_b0,(string *)&j_acroform,(JSON *)&ffh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360[0]._M_refcount);
  std::__cxx11::string::~string((string *)&ffh);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ffh,"needappearances",(allocator<char> *)&local_330);
  QPDFAcroFormDocumentHelper::getNeedAppearances(&afdh);
  JSON::makeBool(false);
  JSON::addDictionaryMember(&local_c0,(string *)&j_acroform,(JSON *)&ffh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360[0]._M_refcount);
  std::__cxx11::string::~string((string *)&ffh);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ffh,"fields",(allocator<char> *)&local_330);
  JSON::makeArray();
  JSON::addDictionaryMember(&j_fields,(string *)&j_acroform,(JSON *)&ffh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360[0]._M_refcount);
  std::__cxx11::string::~string((string *)&ffh);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&ffh,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_218,(QPDFPageDocumentHelper *)&ffh);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&ffh);
  for (pQVar4 = local_218.
                super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pQVar4 != local_218.
                super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                _M_impl.super__Vector_impl_data._M_finish; pQVar4 = pQVar4 + 1) {
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_a0,pQVar4);
    QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(&local_230,&afdh,&local_a0);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_a0);
    pQVar2 = local_230.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = local_230.
                   super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pQVar2;
        this_00 = this_00 + 1) {
      QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,this_00);
      QPDFAcroFormDocumentHelper::getFieldForAnnotation(&ffh,&afdh,&local_68);
      QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (local_360,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &ffh.super_QPDFObjectHelper.super_BaseHandle);
      bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_360);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360[0]._M_refcount);
      if (bVar3) {
        JSON::makeDictionary();
        JSON::addArrayElement(&j_field,&j_fields);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_360[0]._M_refcount);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"object",(allocator<char> *)&j_annot);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&j_choices,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &ffh.super_QPDFObjectHelper.super_BaseHandle);
        json_version = (int)(QPDFFormFieldObjectHelper *)&j_choices;
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_330,json_version,
                   SUB41(*(undefined4 *)(*(long *)local_2f9._1_8_ + 0x288),0));
        JSON::addDictionaryMember(&local_d0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_360,"parent",&local_371);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_2b0,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &ffh.super_QPDFObjectHelper.super_BaseHandle);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"/Parent",local_2f9)
        ;
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&j_annot,(string *)local_2b0);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&j_choices,(int)&j_annot,
                   SUB41(*(undefined4 *)(*(long *)local_2f9._1_8_ + 0x288),0));
        JSON::addDictionaryMember(&local_e0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_annot.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b0 + 8));
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"pageposfrom1",(allocator<char> *)&j_choices);
        JSON::makeInt((longlong)
                      j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
        JSON::addDictionaryMember(&local_f0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"fieldtype",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_(&local_330,&ffh);
        JSON::makeString((string *)&j_choices);
        JSON::addDictionaryMember(&local_100,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"fieldflags",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::getFlags(&ffh);
        JSON::makeInt((longlong)
                      j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
        JSON::addDictionaryMember(&local_110,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"fullname",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_(&local_330,&ffh);
        JSON::makeString((string *)&j_choices);
        JSON::addDictionaryMember(&local_120,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"partialname",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_(&local_330,&ffh);
        JSON::makeString((string *)&j_choices);
        JSON::addDictionaryMember(&local_130,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"alternativename",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_(&local_330,&ffh);
        JSON::makeString((string *)&j_choices);
        JSON::addDictionaryMember(&local_140,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"mappingname",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_(&local_330,&ffh);
        JSON::makeString((string *)&j_choices);
        JSON::addDictionaryMember(&local_150,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"value",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getValue((QPDFFormFieldObjectHelper *)&j_choices);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_330,json_version,
                   SUB41(*(undefined4 *)(*(long *)local_2f9._1_8_ + 0x288),0));
        JSON::addDictionaryMember(&local_160,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"defaultvalue",(allocator<char> *)&j_annot);
        QPDFFormFieldObjectHelper::getDefaultValue((QPDFFormFieldObjectHelper *)&j_choices);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_330,json_version,
                   SUB41(*(undefined4 *)(*(long *)local_2f9._1_8_ + 0x288),0));
        JSON::addDictionaryMember(&local_170,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"quadding",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::getQuadding(&ffh);
        JSON::makeInt((longlong)
                      j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
        JSON::addDictionaryMember(&local_180,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"ischeckbox",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::isCheckbox(&ffh);
        JSON::makeBool(false);
        JSON::addDictionaryMember(&local_190,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_190.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"isradiobutton",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::isRadioButton(&ffh);
        JSON::makeBool(false);
        JSON::addDictionaryMember(&local_1a0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"ischoice",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::isChoice(&ffh);
        JSON::makeBool(false);
        JSON::addDictionaryMember(&local_1b0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"istext",(allocator<char> *)&j_choices);
        QPDFFormFieldObjectHelper::isText(&ffh);
        JSON::makeBool(false);
        JSON::addDictionaryMember(&local_1c0,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"choices",(allocator<char> *)&j_annot);
        JSON::makeArray();
        JSON::addDictionaryMember(&j_choices,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        QPDFFormFieldObjectHelper::getChoices_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_360,&ffh);
        _Var1._M_pi = local_360[0]._M_refcount._M_pi;
        for (peVar5 = local_360[0]._M_ptr; peVar5 != (element_type *)_Var1._M_pi;
            peVar5 = (element_type *)
                     ((long)&(peVar5->value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 0x20)) {
          JSON::makeString(&local_330);
          JSON::addArrayElement(&local_1d0,&j_choices);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"annotation",(allocator<char> *)local_2b0);
        JSON::makeDictionary();
        JSON::addDictionaryMember(&j_annot,(string *)&j_field,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_360,"object",&local_371);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_2b0,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &(this_00->super_QPDFObjectHelper).super_BaseHandle);
        QPDFObjectHandle::getJSON
                  ((QPDFObjectHandle *)&local_330,
                   (int)(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_2b0,
                   SUB41(*(undefined4 *)(*(long *)local_2f9._1_8_ + 0x288),0));
        JSON::addDictionaryMember(&local_1e0,(string *)&j_annot,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b0 + 8));
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"appearancestate",&local_371);
        QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_(&local_330,this_00);
        JSON::makeString((string *)local_2b0);
        JSON::addDictionaryMember(&local_1f0,(string *)&j_annot,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b0 + 8));
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,"annotationflags",(allocator<char> *)local_2b0);
        QPDFAnnotationObjectHelper::getFlags(this_00);
        JSON::makeInt((longlong)
                      j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
        JSON::addDictionaryMember(&local_200,(string *)&j_annot,(JSON *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_200.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        std::__cxx11::string::~string((string *)local_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_annot.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_choices.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&j_field.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&ffh);
    }
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
              (&local_230);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ffh,"acroform",(allocator<char> *)local_360);
  JSON::writeDictionaryItem(p,first,(string *)&ffh,&j_acroform,1);
  std::__cxx11::string::~string((string *)&ffh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_fields.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&afdh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&j_acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void
QPDFJob::doJSONAcroform(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_acroform = JSON::makeDictionary();
    QPDFAcroFormDocumentHelper afdh(pdf);
    j_acroform.addDictionaryMember("hasacroform", JSON::makeBool(afdh.hasAcroForm()));
    j_acroform.addDictionaryMember("needappearances", JSON::makeBool(afdh.getNeedAppearances()));
    JSON j_fields = j_acroform.addDictionaryMember("fields", JSON::makeArray());
    int pagepos1 = 0;
    for (auto const& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        ++pagepos1;
        for (auto& aoh: afdh.getWidgetAnnotationsForPage(page)) {
            QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(aoh);
            if (!ffh.getObjectHandle().isDictionary()) {
                continue;
            }
            JSON j_field = j_fields.addArrayElement(JSON::makeDictionary());
            j_field.addDictionaryMember("object", ffh.getObjectHandle().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "parent", ffh.getObjectHandle().getKey("/Parent").getJSON(m->json_version));
            j_field.addDictionaryMember("pageposfrom1", JSON::makeInt(pagepos1));
            j_field.addDictionaryMember("fieldtype", JSON::makeString(ffh.getFieldType()));
            j_field.addDictionaryMember("fieldflags", JSON::makeInt(ffh.getFlags()));
            j_field.addDictionaryMember("fullname", JSON::makeString(ffh.getFullyQualifiedName()));
            j_field.addDictionaryMember("partialname", JSON::makeString(ffh.getPartialName()));
            j_field.addDictionaryMember(
                "alternativename", JSON::makeString(ffh.getAlternativeName()));
            j_field.addDictionaryMember("mappingname", JSON::makeString(ffh.getMappingName()));
            j_field.addDictionaryMember("value", ffh.getValue().getJSON(m->json_version));
            j_field.addDictionaryMember(
                "defaultvalue", ffh.getDefaultValue().getJSON(m->json_version));
            j_field.addDictionaryMember("quadding", JSON::makeInt(ffh.getQuadding()));
            j_field.addDictionaryMember("ischeckbox", JSON::makeBool(ffh.isCheckbox()));
            j_field.addDictionaryMember("isradiobutton", JSON::makeBool(ffh.isRadioButton()));
            j_field.addDictionaryMember("ischoice", JSON::makeBool(ffh.isChoice()));
            j_field.addDictionaryMember("istext", JSON::makeBool(ffh.isText()));
            JSON j_choices = j_field.addDictionaryMember("choices", JSON::makeArray());
            for (auto const& choice: ffh.getChoices()) {
                j_choices.addArrayElement(JSON::makeString(choice));
            }
            JSON j_annot = j_field.addDictionaryMember("annotation", JSON::makeDictionary());
            j_annot.addDictionaryMember("object", aoh.getObjectHandle().getJSON(m->json_version));
            j_annot.addDictionaryMember(
                "appearancestate", JSON::makeString(aoh.getAppearanceState()));
            j_annot.addDictionaryMember("annotationflags", JSON::makeInt(aoh.getFlags()));
        }
    }
    JSON::writeDictionaryItem(p, first, "acroform", j_acroform, 1);
}